

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct64_low16_ssse3(__m128i *input,__m128i *output)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  __m128i __rounding_00;
  __m128i __rounding_01;
  __m128i __rounding_02;
  __m128i __rounding_03;
  __m128i __rounding_04;
  __m128i __rounding_05;
  __m128i __rounding_06;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  __m128i *x_00;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined2 uVar94;
  short sVar95;
  short sVar96;
  undefined4 uVar97;
  uint uVar98;
  int iVar99;
  uint uVar100;
  int32_t *piVar101;
  undefined8 *in_RDI;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i _in_15;
  __m128i _w1_15;
  __m128i _w0_15;
  __m128i _in_14;
  __m128i _w1_14;
  __m128i _w0_14;
  __m128i _in_13;
  __m128i _w1_13;
  __m128i _w0_13;
  __m128i _in_12;
  __m128i _w1_12;
  __m128i _w0_12;
  __m128i _in_11;
  __m128i _w1_11;
  __m128i _w0_11;
  __m128i _in_10;
  __m128i _w1_10;
  __m128i _w0_10;
  __m128i _in_9;
  __m128i _w1_9;
  __m128i _w0_9;
  __m128i _in_8;
  __m128i _w1_8;
  __m128i _w0_8;
  __m128i _in_7;
  __m128i _w1_7;
  __m128i _w0_7;
  __m128i _in_6;
  __m128i _w1_6;
  __m128i _w0_6;
  __m128i _in_5;
  __m128i _w1_5;
  __m128i _w0_5;
  __m128i _in_4;
  __m128i _w1_4;
  __m128i _w0_4;
  __m128i _in_3;
  __m128i _w1_3;
  __m128i _w0_3;
  __m128i _in_2;
  __m128i _w1_2;
  __m128i _w0_2;
  __m128i _in_1;
  __m128i _w1_1;
  __m128i _w0_1;
  __m128i _in;
  __m128i _w1;
  __m128i _w0;
  __m128i x [64];
  __m128i cospi_m32_p32;
  __m128i cospi_m48_m16;
  __m128i cospi_p48_p16;
  __m128i cospi_m16_p48;
  __m128i cospi_p32_p32;
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  undefined1 uStackY_2142;
  int8_t in_stack_ffffffffffffdebf;
  undefined2 in_stack_ffffffffffffdec0;
  undefined2 in_stack_ffffffffffffdec2;
  undefined2 in_stack_ffffffffffffdec4;
  undefined2 in_stack_ffffffffffffdec6;
  undefined2 in_stack_ffffffffffffdec8;
  undefined2 in_stack_ffffffffffffdeca;
  undefined2 in_stack_ffffffffffffdecc;
  undefined2 in_stack_ffffffffffffdece;
  undefined2 in_stack_ffffffffffffded0;
  undefined2 in_stack_ffffffffffffded2;
  undefined2 in_stack_ffffffffffffded4;
  undefined2 in_stack_ffffffffffffded6;
  undefined4 in_stack_ffffffffffffded8;
  undefined4 in_stack_ffffffffffffdedc;
  longlong lVar118;
  int8_t in_stack_ffffffffffffe31f;
  longlong in_stack_ffffffffffffe320;
  longlong in_stack_ffffffffffffe328;
  undefined2 in_stack_ffffffffffffe338;
  undefined2 in_stack_ffffffffffffe33a;
  undefined2 in_stack_ffffffffffffe33c;
  undefined2 in_stack_ffffffffffffe33e;
  undefined2 in_stack_ffffffffffffe340;
  undefined2 in_stack_ffffffffffffe342;
  undefined2 in_stack_ffffffffffffe344;
  undefined2 in_stack_ffffffffffffe346;
  undefined8 uVar119;
  int8_t cos_bit_00;
  longlong lVar120;
  longlong lVar121;
  int32_t *cospi_00;
  __m128i *x_01;
  int8_t cos_bit_01;
  longlong lVar122;
  longlong lVar123;
  int32_t *cospi_01;
  __m128i *x_02;
  undefined7 local_19a8;
  undefined1 uVar124;
  int8_t cos_bit_02;
  undefined8 uVar125;
  undefined8 uVar126;
  undefined8 uVar127;
  longlong lVar128;
  undefined8 uStack_1990;
  undefined8 uVar129;
  undefined8 uVar130;
  undefined2 local_10c8;
  undefined2 uStack_10c6;
  undefined2 uStack_10c4;
  undefined2 uStack_10c2;
  undefined2 local_10b8;
  undefined2 uStack_10b6;
  undefined2 uStack_10b4;
  undefined2 uStack_10b2;
  undefined2 local_10a8;
  undefined2 uStack_10a6;
  undefined2 uStack_10a4;
  undefined2 uStack_10a2;
  undefined2 local_1098;
  undefined2 uStack_1096;
  undefined2 uStack_1094;
  undefined2 uStack_1092;
  undefined2 local_1088;
  undefined2 uStack_1086;
  undefined2 uStack_1084;
  undefined2 uStack_1082;
  undefined2 local_1078;
  undefined2 uStack_1076;
  undefined2 uStack_1074;
  undefined2 uStack_1072;
  undefined2 local_1068;
  undefined2 uStack_1066;
  undefined2 uStack_1064;
  undefined2 uStack_1062;
  undefined2 local_1058;
  undefined2 uStack_1056;
  undefined2 uStack_1054;
  undefined2 uStack_1052;
  undefined2 local_1048;
  undefined2 uStack_1046;
  undefined2 uStack_1044;
  undefined2 uStack_1042;
  undefined2 local_1038;
  undefined2 uStack_1036;
  undefined2 uStack_1034;
  undefined2 uStack_1032;
  undefined2 uStack_1020;
  undefined2 uStack_101c;
  undefined2 uStack_101a;
  undefined2 uStack_1010;
  undefined2 uStack_100e;
  undefined2 uStack_100c;
  undefined2 uStack_100a;
  undefined2 uStack_1000;
  undefined2 uStack_ffe;
  undefined2 uStack_ffc;
  undefined2 uStack_ffa;
  undefined2 uStack_ff0;
  undefined2 uStack_fee;
  undefined2 uStack_fec;
  undefined2 uStack_fea;
  undefined2 uStack_fe0;
  undefined2 uStack_fde;
  undefined2 uStack_fdc;
  undefined2 uStack_fda;
  undefined2 uStack_fd0;
  undefined2 uStack_fce;
  undefined2 uStack_fcc;
  undefined2 uStack_fca;
  undefined2 uStack_fc0;
  undefined2 uStack_fbe;
  undefined2 uStack_fbc;
  undefined2 uStack_fba;
  undefined2 uStack_fb0;
  undefined2 uStack_fae;
  undefined2 uStack_fac;
  undefined2 uStack_faa;
  undefined2 uStack_fa0;
  undefined2 uStack_f9e;
  undefined2 uStack_f9c;
  undefined2 uStack_f9a;
  undefined2 uStack_f90;
  undefined2 uStack_f8e;
  undefined2 uStack_f8c;
  undefined2 uStack_f8a;
  int local_cf8;
  int iStack_cf4;
  int iStack_cf0;
  int iStack_cec;
  int local_cd8;
  int iStack_cd4;
  int iStack_cd0;
  int iStack_ccc;
  int local_cb8;
  int iStack_cb4;
  int iStack_cb0;
  int iStack_cac;
  int local_c98;
  int iStack_c94;
  int iStack_c90;
  int iStack_c8c;
  int local_c78;
  int iStack_c74;
  int iStack_c70;
  int iStack_c6c;
  int local_c58;
  int iStack_c54;
  int iStack_c50;
  int iStack_c4c;
  int local_c38;
  int iStack_c34;
  int iStack_c30;
  int iStack_c2c;
  int local_c18;
  int iStack_c14;
  int iStack_c10;
  int iStack_c0c;
  int local_bf8;
  int iStack_bf4;
  int iStack_bf0;
  int iStack_bec;
  int local_bd8;
  int iStack_bd4;
  int iStack_bd0;
  int iStack_bcc;
  int local_bb8;
  int iStack_bb4;
  int iStack_bb0;
  int iStack_bac;
  int local_b98;
  int iStack_b94;
  int iStack_b90;
  int iStack_b8c;
  int local_b78;
  int iStack_b74;
  int iStack_b70;
  int iStack_b6c;
  int local_b58;
  int iStack_b54;
  int iStack_b50;
  int iStack_b4c;
  int local_b38;
  int iStack_b34;
  int iStack_b30;
  int iStack_b2c;
  int local_b18;
  int iStack_b14;
  int iStack_b10;
  int iStack_b0c;
  int local_af8;
  int iStack_af4;
  int iStack_af0;
  int iStack_aec;
  int local_ad8;
  int iStack_ad4;
  int iStack_ad0;
  int iStack_acc;
  int local_ab8;
  int iStack_ab4;
  int iStack_ab0;
  int iStack_aac;
  int local_a98;
  int iStack_a94;
  int iStack_a90;
  int iStack_a8c;
  
  piVar101 = cospi_arr(0xc);
  uVar97 = CONCAT22((short)piVar101[0x20],(short)piVar101[0x20]);
  uVar90 = CONCAT44(uVar97,uVar97);
  uVar91 = CONCAT44(uVar97,uVar97);
  uVar98 = -piVar101[0x10] & 0xffffU | piVar101[0x30] << 0x10;
  uVar129 = CONCAT44(uVar98,uVar98);
  uVar130 = CONCAT44(uVar98,uVar98);
  uVar98 = (uint)*(ushort *)(piVar101 + 0x30) | piVar101[0x10] << 0x10;
  iVar99 = (-piVar101[0x30] & 0xffffU) + piVar101[0x10] * -0x10000;
  uVar100 = -piVar101[0x20] & 0xffffU | piVar101[0x20] << 0x10;
  uVar92 = CONCAT44(uVar100,uVar100);
  uVar93 = CONCAT44(uVar100,uVar100);
  uVar125 = in_RDI[1];
  local_19a8 = (undefined7)*in_RDI;
  uVar124 = (undefined1)((ulong)*in_RDI >> 0x38);
  auVar108 = *(undefined1 (*) [16])(in_RDI + 0x10);
  auVar109 = *(undefined1 (*) [16])(in_RDI + 0x10);
  pauVar1 = (undefined1 (*) [16])(in_RDI + 8);
  lVar121 = *(longlong *)*pauVar1;
  pauVar2 = (undefined1 (*) [16])(in_RDI + 10);
  cos_bit_01 = (int8_t)((ulong)*(undefined8 *)*pauVar2 >> 0x38);
  lVar122 = in_RDI[0xb];
  pauVar3 = (undefined1 (*) [16])(in_RDI + 0x1a);
  uVar94 = (undefined2)(piVar101[0x3f] << 3);
  auVar21._2_2_ = uVar94;
  auVar21._0_2_ = uVar94;
  auVar21._4_2_ = uVar94;
  auVar21._6_2_ = uVar94;
  auVar21._10_2_ = uVar94;
  auVar21._8_2_ = uVar94;
  auVar21._12_2_ = uVar94;
  auVar21._14_2_ = uVar94;
  uVar94 = (undefined2)(piVar101[1] << 3);
  auVar20._2_2_ = uVar94;
  auVar20._0_2_ = uVar94;
  auVar20._4_2_ = uVar94;
  auVar20._6_2_ = uVar94;
  auVar20._10_2_ = uVar94;
  auVar20._8_2_ = uVar94;
  auVar20._12_2_ = uVar94;
  auVar20._14_2_ = uVar94;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 2),auVar21);
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 2),auVar20);
  sVar95 = (short)piVar101[0x31] * -8;
  auVar19._2_2_ = sVar95;
  auVar19._0_2_ = sVar95;
  auVar19._4_2_ = sVar95;
  auVar19._6_2_ = sVar95;
  auVar19._10_2_ = sVar95;
  auVar19._8_2_ = sVar95;
  auVar19._12_2_ = sVar95;
  auVar19._14_2_ = sVar95;
  uVar94 = (undefined2)(piVar101[0xf] << 3);
  auVar18._2_2_ = uVar94;
  auVar18._0_2_ = uVar94;
  auVar18._4_2_ = uVar94;
  auVar18._6_2_ = uVar94;
  auVar18._10_2_ = uVar94;
  auVar18._8_2_ = uVar94;
  auVar18._12_2_ = uVar94;
  auVar18._14_2_ = uVar94;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x1e),auVar19);
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x1e),auVar18);
  uVar94 = (undefined2)(piVar101[0x37] << 3);
  auVar17._2_2_ = uVar94;
  auVar17._0_2_ = uVar94;
  auVar17._4_2_ = uVar94;
  auVar17._6_2_ = uVar94;
  auVar17._10_2_ = uVar94;
  auVar17._8_2_ = uVar94;
  auVar17._12_2_ = uVar94;
  auVar17._14_2_ = uVar94;
  uVar94 = (undefined2)(piVar101[9] << 3);
  auVar16._2_2_ = uVar94;
  auVar16._0_2_ = uVar94;
  auVar16._4_2_ = uVar94;
  auVar16._6_2_ = uVar94;
  auVar16._10_2_ = uVar94;
  auVar16._8_2_ = uVar94;
  auVar16._12_2_ = uVar94;
  auVar16._14_2_ = uVar94;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x12),auVar17);
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x12),auVar16);
  sVar95 = (short)piVar101[0x39] * -8;
  auVar15._2_2_ = sVar95;
  auVar15._0_2_ = sVar95;
  auVar15._4_2_ = sVar95;
  auVar15._6_2_ = sVar95;
  auVar15._10_2_ = sVar95;
  auVar15._8_2_ = sVar95;
  auVar15._12_2_ = sVar95;
  auVar15._14_2_ = sVar95;
  uVar94 = (undefined2)(piVar101[7] << 3);
  auVar14._2_2_ = uVar94;
  auVar14._0_2_ = uVar94;
  auVar14._4_2_ = uVar94;
  auVar14._6_2_ = uVar94;
  auVar14._10_2_ = uVar94;
  auVar14._8_2_ = uVar94;
  auVar14._12_2_ = uVar94;
  auVar14._14_2_ = uVar94;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0xe),auVar15);
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0xe),auVar14);
  uVar94 = (undefined2)(piVar101[0x3b] << 3);
  x_02 = (__m128i *)CONCAT26(uVar94,CONCAT24(uVar94,CONCAT22(uVar94,uVar94)));
  auVar13._10_2_ = uVar94;
  auVar13._8_2_ = uVar94;
  auVar13._12_2_ = uVar94;
  auVar13._14_2_ = uVar94;
  uVar94 = (undefined2)(piVar101[5] << 3);
  lVar123 = CONCAT26(uVar94,CONCAT24(uVar94,CONCAT22(uVar94,uVar94)));
  cospi_01 = (int32_t *)CONCAT26(uVar94,CONCAT24(uVar94,CONCAT22(uVar94,uVar94)));
  auVar13._0_8_ = x_02;
  pmulhrsw(*pauVar2,auVar13);
  auVar12._8_8_ = cospi_01;
  auVar12._0_8_ = lVar123;
  pmulhrsw(*pauVar2,auVar12);
  sVar95 = (short)piVar101[0x35] * -8;
  auVar11._2_2_ = sVar95;
  auVar11._0_2_ = sVar95;
  auVar11._4_2_ = sVar95;
  auVar11._6_2_ = sVar95;
  auVar11._10_2_ = sVar95;
  auVar11._8_2_ = sVar95;
  auVar11._12_2_ = sVar95;
  auVar11._14_2_ = sVar95;
  uVar94 = (undefined2)(piVar101[0xb] << 3);
  auVar10._2_2_ = uVar94;
  auVar10._0_2_ = uVar94;
  auVar10._4_2_ = uVar94;
  auVar10._6_2_ = uVar94;
  auVar10._10_2_ = uVar94;
  auVar10._8_2_ = uVar94;
  auVar10._12_2_ = uVar94;
  auVar10._14_2_ = uVar94;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x16),auVar11);
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x16),auVar10);
  uVar94 = (undefined2)(piVar101[0x33] << 3);
  auVar9._2_2_ = uVar94;
  auVar9._0_2_ = uVar94;
  auVar9._4_2_ = uVar94;
  auVar9._6_2_ = uVar94;
  auVar9._10_2_ = uVar94;
  auVar9._8_2_ = uVar94;
  auVar9._12_2_ = uVar94;
  auVar9._14_2_ = uVar94;
  uVar94 = (undefined2)(piVar101[0xd] << 3);
  x_00 = (__m128i *)CONCAT26(uVar94,CONCAT24(uVar94,CONCAT22(uVar94,uVar94)));
  auVar8._10_2_ = uVar94;
  auVar8._8_2_ = uVar94;
  auVar8._12_2_ = uVar94;
  auVar8._14_2_ = uVar94;
  pmulhrsw(*pauVar3,auVar9);
  auVar8._0_8_ = x_00;
  pmulhrsw(*pauVar3,auVar8);
  sVar95 = (short)piVar101[0x3d] * -8;
  auVar7._2_2_ = sVar95;
  auVar7._0_2_ = sVar95;
  auVar7._4_2_ = sVar95;
  auVar7._6_2_ = sVar95;
  lVar118 = CONCAT26(sVar95,CONCAT24(sVar95,CONCAT22(sVar95,sVar95)));
  uVar94 = (undefined2)(piVar101[3] << 3);
  auVar6._2_2_ = uVar94;
  auVar6._0_2_ = uVar94;
  auVar6._4_2_ = uVar94;
  auVar6._6_2_ = uVar94;
  auVar6._10_2_ = uVar94;
  auVar6._8_2_ = uVar94;
  auVar6._12_2_ = uVar94;
  auVar6._14_2_ = uVar94;
  auVar7._8_8_ = lVar118;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 6),auVar7);
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 6),auVar6);
  uVar94 = (undefined2)(piVar101[0x3e] << 3);
  auVar5._2_2_ = uVar94;
  auVar5._0_2_ = uVar94;
  auVar5._4_2_ = uVar94;
  auVar5._6_2_ = uVar94;
  auVar5._10_2_ = uVar94;
  auVar5._8_2_ = uVar94;
  auVar5._12_2_ = uVar94;
  auVar5._14_2_ = uVar94;
  uVar94 = (undefined2)(piVar101[2] << 3);
  auVar4._2_2_ = uVar94;
  auVar4._0_2_ = uVar94;
  auVar4._4_2_ = uVar94;
  auVar4._6_2_ = uVar94;
  auVar4._10_2_ = uVar94;
  auVar4._8_2_ = uVar94;
  auVar4._12_2_ = uVar94;
  auVar4._14_2_ = uVar94;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 4),auVar5);
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 4),auVar4);
  sVar96 = (short)piVar101[0x32] * -8;
  auVar117._2_2_ = sVar96;
  auVar117._0_2_ = sVar96;
  auVar117._4_2_ = sVar96;
  auVar117._6_2_ = sVar96;
  auVar117._10_2_ = sVar96;
  auVar117._8_2_ = sVar96;
  auVar117._12_2_ = sVar96;
  auVar117._14_2_ = sVar96;
  uVar94 = (undefined2)(piVar101[0xe] << 3);
  auVar115._2_2_ = uVar94;
  auVar115._0_2_ = uVar94;
  auVar115._4_2_ = uVar94;
  auVar115._6_2_ = uVar94;
  auVar115._10_2_ = uVar94;
  auVar115._8_2_ = uVar94;
  auVar115._12_2_ = uVar94;
  auVar115._14_2_ = uVar94;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x1c),auVar117);
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x1c),auVar115);
  uVar94 = (undefined2)(piVar101[0x36] << 3);
  auVar114._2_2_ = uVar94;
  auVar114._0_2_ = uVar94;
  auVar114._4_2_ = uVar94;
  auVar114._6_2_ = uVar94;
  auVar114._10_2_ = uVar94;
  auVar114._8_2_ = uVar94;
  auVar114._12_2_ = uVar94;
  auVar114._14_2_ = uVar94;
  uVar94 = (undefined2)(piVar101[10] << 3);
  auVar113._2_2_ = uVar94;
  auVar113._0_2_ = uVar94;
  auVar113._4_2_ = uVar94;
  auVar113._6_2_ = uVar94;
  auVar113._10_2_ = uVar94;
  auVar113._8_2_ = uVar94;
  auVar113._12_2_ = uVar94;
  auVar113._14_2_ = uVar94;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x14),auVar114);
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x14),auVar113);
  sVar96 = (short)piVar101[0x3a] * -8;
  auVar112._2_2_ = sVar96;
  auVar112._0_2_ = sVar96;
  auVar112._4_2_ = sVar96;
  auVar112._6_2_ = sVar96;
  auVar112._10_2_ = sVar96;
  auVar112._8_2_ = sVar96;
  auVar112._12_2_ = sVar96;
  auVar112._14_2_ = sVar96;
  uVar94 = (undefined2)(piVar101[6] << 3);
  auVar116._2_2_ = uVar94;
  auVar116._0_2_ = uVar94;
  auVar116._4_2_ = uVar94;
  auVar116._6_2_ = uVar94;
  auVar116._10_2_ = uVar94;
  auVar116._8_2_ = uVar94;
  auVar116._12_2_ = uVar94;
  auVar116._14_2_ = uVar94;
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0xc),auVar112);
  pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0xc),auVar116);
  uVar94 = (undefined2)(piVar101[0x3c] << 3);
  auVar102._2_2_ = uVar94;
  auVar102._0_2_ = uVar94;
  auVar102._4_2_ = uVar94;
  auVar102._6_2_ = uVar94;
  auVar102._10_2_ = uVar94;
  auVar102._8_2_ = uVar94;
  auVar102._12_2_ = uVar94;
  auVar102._14_2_ = uVar94;
  uVar94 = (undefined2)(piVar101[4] << 3);
  cospi_00 = (int32_t *)CONCAT26(uVar94,CONCAT24(uVar94,CONCAT22(uVar94,uVar94)));
  x_01 = (__m128i *)CONCAT26(uVar94,CONCAT24(uVar94,CONCAT22(uVar94,uVar94)));
  auVar102 = pmulhrsw(*pauVar1,auVar102);
  auVar103._8_8_ = x_01;
  auVar103._0_8_ = cospi_00;
  auVar103 = pmulhrsw(*pauVar1,auVar103);
  sVar96 = (short)piVar101[0x34] * -8;
  uVar119 = CONCAT26(sVar96,CONCAT24(sVar96,CONCAT22(sVar96,sVar96)));
  lVar120 = CONCAT26(sVar96,CONCAT24(sVar96,CONCAT22(sVar96,sVar96)));
  uVar94 = (undefined2)(piVar101[0xc] << 3);
  auVar105._2_2_ = uVar94;
  auVar105._0_2_ = uVar94;
  auVar105._4_2_ = uVar94;
  auVar105._6_2_ = uVar94;
  auVar105._10_2_ = uVar94;
  auVar105._8_2_ = uVar94;
  auVar105._12_2_ = uVar94;
  auVar105._14_2_ = uVar94;
  auVar104._8_8_ = lVar120;
  auVar104._0_8_ = uVar119;
  auVar104 = pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x18),auVar104);
  auVar105 = pmulhrsw(*(undefined1 (*) [16])(in_RDI + 0x18),auVar105);
  __rounding_04[1] = *(longlong *)*pauVar3;
  __rounding_04[0] = lVar118;
  idct64_stage4_high32_sse2
            (x_00,(int32_t *)in_RDI[0x1b],__rounding_04,(int8_t)((ushort)sVar95 >> 8));
  cos_bit_00 = (int8_t)((ulong)uVar119 >> 0x38);
  uVar94 = (undefined2)(piVar101[0x38] << 3);
  auVar106._2_2_ = uVar94;
  auVar106._0_2_ = uVar94;
  auVar106._4_2_ = uVar94;
  auVar106._6_2_ = uVar94;
  auVar106._10_2_ = uVar94;
  auVar106._8_2_ = uVar94;
  auVar106._12_2_ = uVar94;
  auVar106._14_2_ = uVar94;
  uVar94 = (undefined2)(piVar101[8] << 3);
  auVar107._2_2_ = uVar94;
  auVar107._0_2_ = uVar94;
  auVar107._4_2_ = uVar94;
  auVar107._6_2_ = uVar94;
  auVar107._10_2_ = uVar94;
  auVar107._8_2_ = uVar94;
  auVar107._12_2_ = uVar94;
  auVar107._14_2_ = uVar94;
  auVar106 = pmulhrsw(auVar109,auVar106);
  auVar107 = pmulhrsw(auVar108,auVar107);
  __rounding_02[1] = in_stack_ffffffffffffe328;
  __rounding_02[0] = in_stack_ffffffffffffe320;
  idct64_stage5_high48_sse2
            ((__m128i *)
             CONCAT26(in_stack_ffffffffffffe346,
                      CONCAT24(in_stack_ffffffffffffe344,
                               CONCAT22(in_stack_ffffffffffffe342,in_stack_ffffffffffffe340))),
             (int32_t *)
             CONCAT26(in_stack_ffffffffffffe33e,
                      CONCAT24(in_stack_ffffffffffffe33c,
                               CONCAT22(in_stack_ffffffffffffe33a,in_stack_ffffffffffffe338))),
             __rounding_02,in_stack_ffffffffffffe31f);
  uVar94 = (undefined2)(piVar101[0x20] << 3);
  auVar110._2_2_ = uVar94;
  auVar110._0_2_ = uVar94;
  auVar110._4_2_ = uVar94;
  auVar110._6_2_ = uVar94;
  auVar110._10_2_ = uVar94;
  auVar110._8_2_ = uVar94;
  auVar110._12_2_ = uVar94;
  auVar110._14_2_ = uVar94;
  uVar94 = (undefined2)(piVar101[0x20] << 3);
  auVar109._2_2_ = uVar94;
  auVar109._0_2_ = uVar94;
  auVar109._4_2_ = uVar94;
  auVar109._6_2_ = uVar94;
  auVar109._10_2_ = uVar94;
  auVar109._8_2_ = uVar94;
  auVar109._12_2_ = uVar94;
  auVar109._14_2_ = uVar94;
  uVar119 = CONCAT17(uVar124,local_19a8);
  auVar111._8_8_ = uVar125;
  auVar111._0_8_ = uVar119;
  auVar108 = pmulhrsw(auVar111,auVar110);
  local_19a8 = auVar108._0_7_;
  uVar124 = auVar108[7];
  uVar126 = auVar108._8_8_;
  auVar108._8_8_ = uVar125;
  auVar108._0_8_ = uVar119;
  auVar109 = pmulhrsw(auVar108,auVar109);
  uVar127 = auVar109._0_8_;
  uStack_1990 = auVar109._8_8_;
  local_1038 = auVar102._0_2_;
  uStack_1036 = auVar102._2_2_;
  uStack_1034 = auVar102._4_2_;
  uStack_1032 = auVar102._6_2_;
  local_1048 = auVar103._0_2_;
  uStack_1046 = auVar103._2_2_;
  uStack_1044 = auVar103._4_2_;
  uStack_1042 = auVar103._6_2_;
  uStack_f90 = auVar102._8_2_;
  uStack_f8e = auVar102._10_2_;
  uStack_f8c = auVar102._12_2_;
  uStack_f8a = auVar102._14_2_;
  uStack_fa0 = auVar103._8_2_;
  uStack_f9e = auVar103._10_2_;
  uStack_f9c = auVar103._12_2_;
  uStack_f9a = auVar103._14_2_;
  auVar61._2_2_ = local_1048;
  auVar61._0_2_ = local_1038;
  auVar61._4_2_ = uStack_1036;
  auVar61._6_2_ = uStack_1046;
  auVar61._10_2_ = uStack_1044;
  auVar61._8_2_ = uStack_1034;
  auVar61._12_2_ = uStack_1032;
  auVar61._14_2_ = uStack_1042;
  auVar60._8_8_ = uVar130;
  auVar60._0_8_ = uVar129;
  auVar109 = pmaddwd(auVar61,auVar60);
  auVar59._2_2_ = uStack_fa0;
  auVar59._0_2_ = uStack_f90;
  auVar59._4_2_ = uStack_f8e;
  auVar59._6_2_ = uStack_f9e;
  auVar59._10_2_ = uStack_f9c;
  auVar59._8_2_ = uStack_f8c;
  auVar59._12_2_ = uStack_f8a;
  auVar59._14_2_ = uStack_f9a;
  auVar58._8_8_ = uVar130;
  auVar58._0_8_ = uVar129;
  auVar108 = pmaddwd(auVar59,auVar58);
  auVar57._2_2_ = local_1048;
  auVar57._0_2_ = local_1038;
  auVar57._4_2_ = uStack_1036;
  auVar57._6_2_ = uStack_1046;
  auVar57._10_2_ = uStack_1044;
  auVar57._8_2_ = uStack_1034;
  auVar57._12_2_ = uStack_1032;
  auVar57._14_2_ = uStack_1042;
  auVar56._8_8_ = CONCAT44(uVar98,uVar98);
  auVar56._0_8_ = CONCAT44(uVar98,uVar98);
  auVar110 = pmaddwd(auVar57,auVar56);
  auVar55._2_2_ = uStack_fa0;
  auVar55._0_2_ = uStack_f90;
  auVar55._4_2_ = uStack_f8e;
  auVar55._6_2_ = uStack_f9e;
  auVar55._10_2_ = uStack_f9c;
  auVar55._8_2_ = uStack_f8c;
  auVar55._12_2_ = uStack_f8a;
  auVar55._14_2_ = uStack_f9a;
  auVar54._8_8_ = CONCAT44(uVar98,uVar98);
  auVar54._0_8_ = CONCAT44(uVar98,uVar98);
  auVar111 = pmaddwd(auVar55,auVar54);
  lVar118 = auVar111._0_8_;
  piVar101 = auVar111._8_8_;
  local_a98 = auVar109._0_4_;
  iStack_a94 = auVar109._4_4_;
  iStack_a90 = auVar109._8_4_;
  iStack_a8c = auVar109._12_4_;
  iStack_a94 = iStack_a94 + 0x800;
  iStack_a90 = iStack_a90 + 0x800;
  iStack_a8c = iStack_a8c + 0x800;
  local_ab8 = auVar108._0_4_;
  iStack_ab4 = auVar108._4_4_;
  iStack_ab0 = auVar108._8_4_;
  iStack_aac = auVar108._12_4_;
  local_ad8 = auVar110._0_4_;
  iStack_ad4 = auVar110._4_4_;
  iStack_ad0 = auVar110._8_4_;
  iStack_acc = auVar110._12_4_;
  local_af8 = auVar111._0_4_;
  iStack_af4 = auVar111._4_4_;
  iStack_af0 = auVar111._8_4_;
  iStack_aec = auVar111._12_4_;
  auVar109 = ZEXT416(0xc);
  auVar108 = ZEXT416(0xc);
  auVar111 = ZEXT416(0xc);
  auVar116 = ZEXT416(0xc);
  auVar81._4_4_ = iStack_a94 >> auVar109;
  auVar81._0_4_ = local_a98 + 0x800 >> auVar109;
  auVar81._12_4_ = iStack_a8c >> auVar109;
  auVar81._8_4_ = iStack_a90 >> auVar109;
  auVar80._4_4_ = iStack_ab4 + 0x800 >> auVar108;
  auVar80._0_4_ = local_ab8 + 0x800 >> auVar108;
  auVar80._12_4_ = iStack_aac + 0x800 >> auVar108;
  auVar80._8_4_ = iStack_ab0 + 0x800 >> auVar108;
  auVar109 = packssdw(auVar81,auVar80);
  auVar79._4_4_ = iStack_ad4 + 0x800 >> auVar111;
  auVar79._0_4_ = local_ad8 + 0x800 >> auVar111;
  auVar79._12_4_ = iStack_acc + 0x800 >> auVar111;
  auVar79._8_4_ = iStack_ad0 + 0x800 >> auVar111;
  auVar78._4_4_ = iStack_af4 + 0x800 >> auVar116;
  auVar78._0_4_ = local_af8 + 0x800 >> auVar116;
  auVar78._12_4_ = iStack_aec + 0x800 >> auVar116;
  auVar78._8_4_ = iStack_af0 + 0x800 >> auVar116;
  auVar108 = packssdw(auVar79,auVar78);
  local_1058 = auVar104._0_2_;
  uStack_1056 = auVar104._2_2_;
  uStack_1054 = auVar104._4_2_;
  uStack_1052 = auVar104._6_2_;
  local_1068 = auVar105._0_2_;
  uStack_1066 = auVar105._2_2_;
  uStack_1064 = auVar105._4_2_;
  uStack_1062 = auVar105._6_2_;
  uStack_fb0 = auVar104._8_2_;
  uStack_fae = auVar104._10_2_;
  uStack_fac = auVar104._12_2_;
  uStack_faa = auVar104._14_2_;
  uStack_fc0 = auVar105._8_2_;
  uStack_fbe = auVar105._10_2_;
  uStack_fbc = auVar105._12_2_;
  uStack_fba = auVar105._14_2_;
  auVar53._2_2_ = local_1068;
  auVar53._0_2_ = local_1058;
  auVar53._4_2_ = uStack_1056;
  auVar53._6_2_ = uStack_1066;
  auVar53._10_2_ = uStack_1064;
  auVar53._8_2_ = uStack_1054;
  auVar53._12_2_ = uStack_1052;
  auVar53._14_2_ = uStack_1062;
  auVar52._8_8_ = CONCAT44(iVar99,iVar99);
  auVar52._0_8_ = CONCAT44(iVar99,iVar99);
  auVar111 = pmaddwd(auVar53,auVar52);
  auVar51._2_2_ = uStack_fc0;
  auVar51._0_2_ = uStack_fb0;
  auVar51._4_2_ = uStack_fae;
  auVar51._6_2_ = uStack_fbe;
  auVar51._10_2_ = uStack_fbc;
  auVar51._8_2_ = uStack_fac;
  auVar51._12_2_ = uStack_faa;
  auVar51._14_2_ = uStack_fba;
  auVar50._8_8_ = CONCAT44(iVar99,iVar99);
  auVar50._0_8_ = CONCAT44(iVar99,iVar99);
  auVar116 = pmaddwd(auVar51,auVar50);
  auVar49._2_2_ = local_1068;
  auVar49._0_2_ = local_1058;
  auVar49._4_2_ = uStack_1056;
  auVar49._6_2_ = uStack_1066;
  auVar49._10_2_ = uStack_1064;
  auVar49._8_2_ = uStack_1054;
  auVar49._12_2_ = uStack_1052;
  auVar49._14_2_ = uStack_1062;
  auVar48._8_8_ = uVar130;
  auVar48._0_8_ = uVar129;
  auVar112 = pmaddwd(auVar49,auVar48);
  auVar47._2_2_ = uStack_fc0;
  auVar47._0_2_ = uStack_fb0;
  auVar47._4_2_ = uStack_fae;
  auVar47._6_2_ = uStack_fbe;
  auVar47._10_2_ = uStack_fbc;
  auVar47._8_2_ = uStack_fac;
  auVar47._12_2_ = uStack_faa;
  auVar47._14_2_ = uStack_fba;
  auVar46._8_8_ = uVar130;
  auVar46._0_8_ = uVar129;
  auVar113 = pmaddwd(auVar47,auVar46);
  local_b18 = auVar111._0_4_;
  iStack_b14 = auVar111._4_4_;
  iStack_b10 = auVar111._8_4_;
  iStack_b0c = auVar111._12_4_;
  local_b38 = auVar116._0_4_;
  iStack_b34 = auVar116._4_4_;
  iStack_b30 = auVar116._8_4_;
  iStack_b2c = auVar116._12_4_;
  local_b58 = auVar112._0_4_;
  iStack_b54 = auVar112._4_4_;
  iStack_b50 = auVar112._8_4_;
  iStack_b4c = auVar112._12_4_;
  local_b78 = auVar113._0_4_;
  iStack_b74 = auVar113._4_4_;
  iStack_b70 = auVar113._8_4_;
  iStack_b6c = auVar113._12_4_;
  auVar111 = ZEXT416(0xc);
  auVar116 = ZEXT416(0xc);
  auVar112 = ZEXT416(0xc);
  auVar113 = ZEXT416(0xc);
  auVar77._4_4_ = iStack_b14 + 0x800 >> auVar111;
  auVar77._0_4_ = local_b18 + 0x800 >> auVar111;
  auVar77._12_4_ = iStack_b0c + 0x800 >> auVar111;
  auVar77._8_4_ = iStack_b10 + 0x800 >> auVar111;
  auVar76._4_4_ = iStack_b34 + 0x800 >> auVar116;
  auVar76._0_4_ = local_b38 + 0x800 >> auVar116;
  auVar76._12_4_ = iStack_b2c + 0x800 >> auVar116;
  auVar76._8_4_ = iStack_b30 + 0x800 >> auVar116;
  auVar111 = packssdw(auVar77,auVar76);
  auVar75._4_4_ = iStack_b54 + 0x800 >> auVar112;
  auVar75._0_4_ = local_b58 + 0x800 >> auVar112;
  auVar75._12_4_ = iStack_b4c + 0x800 >> auVar112;
  auVar75._8_4_ = iStack_b50 + 0x800 >> auVar112;
  auVar74._4_4_ = iStack_b74 + 0x800 >> auVar113;
  auVar74._0_4_ = local_b78 + 0x800 >> auVar113;
  auVar74._12_4_ = iStack_b6c + 0x800 >> auVar113;
  auVar74._8_4_ = iStack_b70 + 0x800 >> auVar113;
  auVar116 = packssdw(auVar75,auVar74);
  __rounding_00[0]._2_2_ = in_stack_ffffffffffffdec2;
  __rounding_00[0]._0_2_ = in_stack_ffffffffffffdec0;
  __rounding_00[0]._4_2_ = in_stack_ffffffffffffdec4;
  __rounding_00[0]._6_2_ = in_stack_ffffffffffffdec6;
  __rounding_00[1]._0_2_ = in_stack_ffffffffffffdec8;
  __rounding_00[1]._2_2_ = in_stack_ffffffffffffdeca;
  __rounding_00[1]._4_2_ = in_stack_ffffffffffffdecc;
  __rounding_00[1]._6_2_ = in_stack_ffffffffffffdece;
  idct64_stage6_high48_sse2
            ((__m128i *)CONCAT44(in_stack_ffffffffffffdedc,in_stack_ffffffffffffded8),
             (int32_t *)
             CONCAT26(in_stack_ffffffffffffded6,
                      CONCAT24(in_stack_ffffffffffffded4,
                               CONCAT22(in_stack_ffffffffffffded2,in_stack_ffffffffffffded0))),
             __rounding_00,in_stack_ffffffffffffdebf);
  uVar125 = CONCAT17(uVar124,local_19a8);
  local_1078 = auVar106._0_2_;
  uStack_1076 = auVar106._2_2_;
  uStack_1074 = auVar106._4_2_;
  uStack_1072 = auVar106._6_2_;
  local_1088 = auVar107._0_2_;
  uStack_1086 = auVar107._2_2_;
  uStack_1084 = auVar107._4_2_;
  uStack_1082 = auVar107._6_2_;
  uStack_fd0 = auVar106._8_2_;
  uStack_fce = auVar106._10_2_;
  uStack_fcc = auVar106._12_2_;
  uStack_fca = auVar106._14_2_;
  uStack_fe0 = auVar107._8_2_;
  uStack_fde = auVar107._10_2_;
  uStack_fdc = auVar107._12_2_;
  uStack_fda = auVar107._14_2_;
  auVar45._2_2_ = local_1088;
  auVar45._0_2_ = local_1078;
  auVar45._4_2_ = uStack_1076;
  auVar45._6_2_ = uStack_1086;
  auVar45._10_2_ = uStack_1084;
  auVar45._8_2_ = uStack_1074;
  auVar45._12_2_ = uStack_1072;
  auVar45._14_2_ = uStack_1082;
  auVar44._8_8_ = uVar93;
  auVar44._0_8_ = uVar92;
  auVar112 = pmaddwd(auVar45,auVar44);
  auVar43._2_2_ = uStack_fe0;
  auVar43._0_2_ = uStack_fd0;
  auVar43._4_2_ = uStack_fce;
  auVar43._6_2_ = uStack_fde;
  auVar43._10_2_ = uStack_fdc;
  auVar43._8_2_ = uStack_fcc;
  auVar43._12_2_ = uStack_fca;
  auVar43._14_2_ = uStack_fda;
  auVar42._8_8_ = uVar93;
  auVar42._0_8_ = uVar92;
  auVar113 = pmaddwd(auVar43,auVar42);
  auVar41._2_2_ = local_1088;
  auVar41._0_2_ = local_1078;
  auVar41._4_2_ = uStack_1076;
  auVar41._6_2_ = uStack_1086;
  auVar41._10_2_ = uStack_1084;
  auVar41._8_2_ = uStack_1074;
  auVar41._12_2_ = uStack_1072;
  auVar41._14_2_ = uStack_1082;
  auVar40._8_8_ = uVar91;
  auVar40._0_8_ = uVar90;
  auVar114 = pmaddwd(auVar41,auVar40);
  auVar39._2_2_ = uStack_fe0;
  auVar39._0_2_ = uStack_fd0;
  auVar39._4_2_ = uStack_fce;
  auVar39._6_2_ = uStack_fde;
  auVar39._10_2_ = uStack_fdc;
  auVar39._8_2_ = uStack_fcc;
  auVar39._12_2_ = uStack_fca;
  auVar39._14_2_ = uStack_fda;
  auVar38._8_8_ = uVar91;
  auVar38._0_8_ = uVar90;
  auVar115 = pmaddwd(auVar39,auVar38);
  local_b98 = auVar112._0_4_;
  iStack_b94 = auVar112._4_4_;
  iStack_b90 = auVar112._8_4_;
  iStack_b8c = auVar112._12_4_;
  iStack_b90 = iStack_b90 + 0x800;
  iStack_b8c = iStack_b8c + 0x800;
  local_bb8 = auVar113._0_4_;
  iStack_bb4 = auVar113._4_4_;
  iStack_bb0 = auVar113._8_4_;
  iStack_bac = auVar113._12_4_;
  local_bd8 = auVar114._0_4_;
  iStack_bd4 = auVar114._4_4_;
  iStack_bd0 = auVar114._8_4_;
  iStack_bcc = auVar114._12_4_;
  local_bf8 = auVar115._0_4_;
  iStack_bf4 = auVar115._4_4_;
  iStack_bf0 = auVar115._8_4_;
  iStack_bec = auVar115._12_4_;
  auVar112 = ZEXT416(0xc);
  auVar113 = ZEXT416(0xc);
  auVar114 = ZEXT416(0xc);
  auVar117 = ZEXT416(0xc);
  auVar73._4_4_ = iStack_b94 + 0x800 >> auVar112;
  auVar73._0_4_ = local_b98 + 0x800 >> auVar112;
  auVar73._12_4_ = iStack_b8c >> auVar112;
  auVar73._8_4_ = iStack_b90 >> auVar112;
  auVar72._4_4_ = iStack_bb4 + 0x800 >> auVar113;
  auVar72._0_4_ = local_bb8 + 0x800 >> auVar113;
  auVar72._12_4_ = iStack_bac + 0x800 >> auVar113;
  auVar72._8_4_ = iStack_bb0 + 0x800 >> auVar113;
  auVar112 = packssdw(auVar73,auVar72);
  auVar71._4_4_ = iStack_bd4 + 0x800 >> auVar114;
  auVar71._0_4_ = local_bd8 + 0x800 >> auVar114;
  auVar71._12_4_ = iStack_bcc + 0x800 >> auVar114;
  auVar71._8_4_ = iStack_bd0 + 0x800 >> auVar114;
  auVar70._4_4_ = iStack_bf4 + 0x800 >> auVar117;
  auVar70._0_4_ = local_bf8 + 0x800 >> auVar117;
  auVar70._12_4_ = iStack_bec + 0x800 >> auVar117;
  auVar70._8_4_ = iStack_bf0 + 0x800 >> auVar117;
  auVar113 = packssdw(auVar71,auVar70);
  paddsw(auVar102,auVar104);
  auVar104 = psubsw(auVar102,auVar104);
  paddsw(auVar109,auVar111);
  auVar109 = psubsw(auVar109,auVar111);
  auVar111 = psubsw(auVar103,auVar105);
  paddsw(auVar103,auVar105);
  auVar105 = psubsw(auVar108,auVar116);
  paddsw(auVar108,auVar116);
  __rounding_01[0]._4_4_ = iStack_a8c;
  __rounding_01[0]._0_4_ = iStack_a90;
  __rounding_01[1] = lVar118;
  uVar119 = uVar126;
  uVar129 = uVar127;
  uVar130 = uStack_1990;
  idct64_stage7_high48_sse2
            (auVar110._0_8_,piVar101,__rounding_01,(int8_t)((uint)iStack_a94 >> 0x18));
  auVar85._8_8_ = uVar119;
  auVar85._0_8_ = CONCAT17(uVar124,local_19a8);
  auVar108 = paddsw(auVar85,auVar107);
  cos_bit_02 = auVar108[7];
  lVar118 = auVar108._8_8_;
  auVar89._8_8_ = uVar119;
  auVar89._0_8_ = CONCAT17(uVar124,local_19a8);
  psubsw(auVar89,auVar107);
  auVar84._8_8_ = uStack_1990;
  auVar84._0_8_ = uVar127;
  auVar108 = paddsw(auVar84,auVar113);
  lVar128 = auVar108._0_8_;
  auVar88._8_8_ = uStack_1990;
  auVar88._0_8_ = uVar127;
  psubsw(auVar88,auVar113);
  auVar83._8_8_ = uVar130;
  auVar83._0_8_ = uVar129;
  auVar108 = paddsw(auVar83,auVar112);
  auVar87._8_8_ = uVar130;
  auVar87._0_8_ = uVar129;
  psubsw(auVar87,auVar112);
  auVar82._8_8_ = uVar126;
  auVar82._0_8_ = uVar125;
  paddsw(auVar82,auVar106);
  auVar86._8_8_ = uVar126;
  auVar86._0_8_ = uVar125;
  psubsw(auVar86,auVar106);
  local_1098 = auVar109._0_2_;
  uStack_1096 = auVar109._2_2_;
  uStack_1094 = auVar109._4_2_;
  uStack_1092 = auVar109._6_2_;
  local_10a8 = auVar105._0_2_;
  uStack_10a6 = auVar105._2_2_;
  uStack_10a4 = auVar105._4_2_;
  uStack_10a2 = auVar105._6_2_;
  uStack_ff0 = auVar109._8_2_;
  uStack_fee = auVar109._10_2_;
  uStack_fec = auVar109._12_2_;
  uStack_fea = auVar109._14_2_;
  uStack_1000 = auVar105._8_2_;
  uStack_ffe = auVar105._10_2_;
  uStack_ffc = auVar105._12_2_;
  uStack_ffa = auVar105._14_2_;
  auVar37._2_2_ = local_10a8;
  auVar37._0_2_ = local_1098;
  auVar37._4_2_ = uStack_1096;
  auVar37._6_2_ = uStack_10a6;
  auVar37._10_2_ = uStack_10a4;
  auVar37._8_2_ = uStack_1094;
  auVar37._12_2_ = uStack_1092;
  auVar37._14_2_ = uStack_10a2;
  auVar36._8_8_ = uVar93;
  auVar36._0_8_ = uVar92;
  auVar109 = pmaddwd(auVar37,auVar36);
  auVar35._2_2_ = uStack_1000;
  auVar35._0_2_ = uStack_ff0;
  auVar35._4_2_ = uStack_fee;
  auVar35._6_2_ = uStack_ffe;
  auVar35._10_2_ = uStack_ffc;
  auVar35._8_2_ = uStack_fec;
  auVar35._12_2_ = uStack_fea;
  auVar35._14_2_ = uStack_ffa;
  auVar34._8_8_ = uVar93;
  auVar34._0_8_ = uVar92;
  auVar110 = pmaddwd(auVar35,auVar34);
  auVar33._2_2_ = local_10a8;
  auVar33._0_2_ = local_1098;
  auVar33._4_2_ = uStack_1096;
  auVar33._6_2_ = uStack_10a6;
  auVar33._10_2_ = uStack_10a4;
  auVar33._8_2_ = uStack_1094;
  auVar33._12_2_ = uStack_1092;
  auVar33._14_2_ = uStack_10a2;
  auVar32._8_8_ = uVar91;
  auVar32._0_8_ = uVar90;
  auVar107 = pmaddwd(auVar33,auVar32);
  auVar31._2_2_ = uStack_1000;
  auVar31._0_2_ = uStack_ff0;
  auVar31._4_2_ = uStack_fee;
  auVar31._6_2_ = uStack_ffe;
  auVar31._10_2_ = uStack_ffc;
  auVar31._8_2_ = uStack_fec;
  auVar31._12_2_ = uStack_fea;
  auVar31._14_2_ = uStack_ffa;
  auVar30._8_8_ = uVar91;
  auVar30._0_8_ = uVar90;
  auVar106 = pmaddwd(auVar31,auVar30);
  local_c18 = auVar109._0_4_;
  iStack_c14 = auVar109._4_4_;
  iStack_c10 = auVar109._8_4_;
  iStack_c0c = auVar109._12_4_;
  local_c38 = auVar110._0_4_;
  iStack_c34 = auVar110._4_4_;
  iStack_c30 = auVar110._8_4_;
  iStack_c2c = auVar110._12_4_;
  local_c58 = auVar107._0_4_;
  iStack_c54 = auVar107._4_4_;
  iStack_c50 = auVar107._8_4_;
  iStack_c4c = auVar107._12_4_;
  local_c78 = auVar106._0_4_;
  iStack_c74 = auVar106._4_4_;
  iStack_c70 = auVar106._8_4_;
  iStack_c6c = auVar106._12_4_;
  auVar109 = ZEXT416(0xc);
  auVar110 = ZEXT416(0xc);
  auVar107 = ZEXT416(0xc);
  auVar106 = ZEXT416(0xc);
  auVar69._4_4_ = iStack_c14 + 0x800 >> auVar109;
  auVar69._0_4_ = local_c18 + 0x800 >> auVar109;
  auVar69._12_4_ = iStack_c0c + 0x800 >> auVar109;
  auVar69._8_4_ = iStack_c10 + 0x800 >> auVar109;
  auVar68._4_4_ = iStack_c34 + 0x800 >> auVar110;
  auVar68._0_4_ = local_c38 + 0x800 >> auVar110;
  auVar68._12_4_ = iStack_c2c + 0x800 >> auVar110;
  auVar68._8_4_ = iStack_c30 + 0x800 >> auVar110;
  packssdw(auVar69,auVar68);
  auVar67._4_4_ = iStack_c54 + 0x800 >> auVar107;
  auVar67._0_4_ = local_c58 + 0x800 >> auVar107;
  auVar67._12_4_ = iStack_c4c + 0x800 >> auVar107;
  auVar67._8_4_ = iStack_c50 + 0x800 >> auVar107;
  auVar66._4_4_ = iStack_c74 + 0x800 >> auVar106;
  auVar66._0_4_ = local_c78 + 0x800 >> auVar106;
  auVar66._12_4_ = iStack_c6c + 0x800 >> auVar106;
  auVar66._8_4_ = iStack_c70 + 0x800 >> auVar106;
  packssdw(auVar67,auVar66);
  local_10b8 = auVar104._0_2_;
  uStack_10b6 = auVar104._2_2_;
  uStack_10b4 = auVar104._4_2_;
  uStack_10b2 = auVar104._6_2_;
  local_10c8 = auVar111._0_2_;
  uStack_10c6 = auVar111._2_2_;
  uStack_10c4 = auVar111._4_2_;
  uStack_10c2 = auVar111._6_2_;
  uStack_1010 = auVar104._8_2_;
  uStack_100e = auVar104._10_2_;
  uStack_100c = auVar104._12_2_;
  uStack_100a = auVar104._14_2_;
  uStack_1020 = auVar111._8_2_;
  uStack_101c = auVar111._12_2_;
  uStack_101a = auVar111._14_2_;
  uStackY_2142 = auVar111[10];
  auVar29._2_2_ = local_10c8;
  auVar29._0_2_ = local_10b8;
  auVar29._4_2_ = uStack_10b6;
  auVar29._6_2_ = uStack_10c6;
  auVar29._10_2_ = uStack_10c4;
  auVar29._8_2_ = uStack_10b4;
  auVar29._12_2_ = uStack_10b2;
  auVar29._14_2_ = uStack_10c2;
  auVar28._8_8_ = uVar93;
  auVar28._0_8_ = uVar92;
  auVar109 = pmaddwd(auVar29,auVar28);
  auVar27._2_2_ = uStack_1020;
  auVar27._0_2_ = uStack_1010;
  auVar27._4_2_ = uStack_100e;
  auVar27[6] = uStackY_2142;
  auVar27[7] = auVar111[0xb];
  auVar27._10_2_ = uStack_101c;
  auVar27._8_2_ = uStack_100c;
  auVar27._12_2_ = uStack_100a;
  auVar27._14_2_ = uStack_101a;
  auVar26._8_8_ = uVar93;
  auVar26._0_8_ = uVar92;
  auVar110 = pmaddwd(auVar27,auVar26);
  auVar25._2_2_ = local_10c8;
  auVar25._0_2_ = local_10b8;
  auVar25._4_2_ = uStack_10b6;
  auVar25._6_2_ = uStack_10c6;
  auVar25._10_2_ = uStack_10c4;
  auVar25._8_2_ = uStack_10b4;
  auVar25._12_2_ = uStack_10b2;
  auVar25._14_2_ = uStack_10c2;
  auVar24._8_8_ = uVar91;
  auVar24._0_8_ = uVar90;
  auVar107 = pmaddwd(auVar25,auVar24);
  auVar23._2_2_ = uStack_1020;
  auVar23._0_2_ = uStack_1010;
  auVar23._4_2_ = uStack_100e;
  auVar23[6] = uStackY_2142;
  auVar23[7] = auVar111[0xb];
  auVar23._10_2_ = uStack_101c;
  auVar23._8_2_ = uStack_100c;
  auVar23._12_2_ = uStack_100a;
  auVar23._14_2_ = uStack_101a;
  auVar22._8_8_ = uVar91;
  auVar22._0_8_ = uVar90;
  auVar111 = pmaddwd(auVar23,auVar22);
  local_c98 = auVar109._0_4_;
  iStack_c94 = auVar109._4_4_;
  iStack_c90 = auVar109._8_4_;
  iStack_c8c = auVar109._12_4_;
  local_cb8 = auVar110._0_4_;
  iStack_cb4 = auVar110._4_4_;
  iStack_cb0 = auVar110._8_4_;
  iStack_cac = auVar110._12_4_;
  local_cd8 = auVar107._0_4_;
  iStack_cd4 = auVar107._4_4_;
  iStack_cd0 = auVar107._8_4_;
  iStack_ccc = auVar107._12_4_;
  local_cf8 = auVar111._0_4_;
  iStack_cf4 = auVar111._4_4_;
  iStack_cf0 = auVar111._8_4_;
  iStack_cec = auVar111._12_4_;
  auVar109 = ZEXT416(0xc);
  auVar110 = ZEXT416(0xc);
  auVar111 = ZEXT416(0xc);
  auVar107 = ZEXT416(0xc);
  auVar65._4_4_ = iStack_c94 + 0x800 >> auVar109;
  auVar65._0_4_ = local_c98 + 0x800 >> auVar109;
  auVar65._12_4_ = iStack_c8c + 0x800 >> auVar109;
  auVar65._8_4_ = iStack_c90 + 0x800 >> auVar109;
  auVar64._4_4_ = iStack_cb4 + 0x800 >> auVar110;
  auVar64._0_4_ = local_cb8 + 0x800 >> auVar110;
  auVar64._12_4_ = iStack_cac + 0x800 >> auVar110;
  auVar64._8_4_ = iStack_cb0 + 0x800 >> auVar110;
  packssdw(auVar65,auVar64);
  auVar63._4_4_ = iStack_cd4 + 0x800 >> auVar111;
  auVar63._0_4_ = local_cd8 + 0x800 >> auVar111;
  auVar63._12_4_ = iStack_ccc + 0x800 >> auVar111;
  auVar63._8_4_ = iStack_cd0 + 0x800 >> auVar111;
  auVar62._4_4_ = iStack_cf4 + 0x800 >> auVar107;
  auVar62._0_4_ = local_cf8 + 0x800 >> auVar107;
  auVar62._12_4_ = iStack_cec + 0x800 >> auVar107;
  auVar62._8_4_ = iStack_cf0 + 0x800 >> auVar107;
  packssdw(auVar63,auVar62);
  __rounding_05[1] = lVar123;
  __rounding_05[0] = lVar122;
  idct64_stage8_high48_sse2(x_02,cospi_01,__rounding_05,cos_bit_01);
  __rounding_03[1] = lVar121;
  __rounding_03[0] = lVar120;
  idct64_stage9_sse2(x_01,cospi_00,__rounding_03,cos_bit_00);
  __rounding_06[1] = lVar128;
  __rounding_06[0] = lVar118;
  idct64_stage10_sse2(auVar108._8_8_,auVar108._0_8_,__rounding_06,cos_bit_02);
  idct64_stage11_sse2(auVar115._0_8_,(__m128i *)CONCAT44(iStack_b8c,iStack_b90));
  return;
}

Assistant:

static void idct64_low16_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[64];
  x[0] = input[0];
  x[4] = input[8];
  x[8] = input[4];
  x[12] = input[12];
  x[16] = input[2];
  x[20] = input[10];
  x[24] = input[6];
  x[28] = input[14];
  x[32] = input[1];
  x[36] = input[9];
  x[40] = input[5];
  x[44] = input[13];
  x[48] = input[3];
  x[52] = input[11];
  x[56] = input[7];
  x[60] = input[15];

  // stage 2
  btf_16_ssse3(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_ssse3(-cospi[49], cospi[15], x[60], x[35], x[60]);
  btf_16_ssse3(cospi[55], cospi[9], x[36], x[36], x[59]);
  btf_16_ssse3(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_ssse3(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_ssse3(-cospi[53], cospi[11], x[52], x[43], x[52]);
  btf_16_ssse3(cospi[51], cospi[13], x[44], x[44], x[51]);
  btf_16_ssse3(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_ssse3(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);
  x[33] = x[32];
  x[34] = x[35];
  x[37] = x[36];
  x[38] = x[39];
  x[41] = x[40];
  x[42] = x[43];
  x[45] = x[44];
  x[46] = x[47];
  x[49] = x[48];
  x[50] = x[51];
  x[53] = x[52];
  x[54] = x[55];
  x[57] = x[56];
  x[58] = x[59];
  x[61] = x[60];
  x[62] = x[63];

  // stage 4
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);
  x[17] = x[16];
  x[18] = x[19];
  x[21] = x[20];
  x[22] = x[23];
  x[25] = x[24];
  x[26] = x[27];
  x[29] = x[28];
  x[30] = x[31];
  idct64_stage4_high32_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  x[9] = x[8];
  x[10] = x[11];
  x[13] = x[12];
  x[14] = x[15];
  idct64_stage5_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 6
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  x[5] = x[4];
  x[6] = x[7];
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);
  idct64_stage6_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 7
  x[3] = x[0];
  x[2] = x[1];
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[11]);
  btf_16_adds_subs_sse2(x[9], x[10]);
  btf_16_subs_adds_sse2(x[15], x[12]);
  btf_16_subs_adds_sse2(x[14], x[13]);
  idct64_stage7_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 8
  btf_16_adds_subs_sse2(x[0], x[7]);
  btf_16_adds_subs_sse2(x[1], x[6]);
  btf_16_adds_subs_sse2(x[2], x[5]);
  btf_16_adds_subs_sse2(x[3], x[4]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);
  idct64_stage8_high48_sse2(x, cospi, __rounding, cos_bit);

  idct64_stage9_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage10_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage11_sse2(output, x);
}